

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall wasm::ContentOracle::analyze(ContentOracle *this)

{
  size_type sVar1;
  PossibleContents *other;
  Location *__k;
  mapped_type *this_00;
  uint local_17c;
  undefined1 local_178 [4];
  LocationIndex i;
  Flower flower;
  ContentOracle *this_local;
  
  flower.maxDepths._M_h._M_single_bucket = (__node_base_ptr)this;
  anon_unknown_183::Flower::Flower((Flower *)local_178,this->wasm,this->options);
  local_17c = 0;
  while( true ) {
    sVar1 = std::
            vector<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
            ::size((vector<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
                    *)&flower.options);
    if (sVar1 <= local_17c) break;
    other = anon_unknown_183::Flower::getContents((Flower *)local_178,local_17c);
    __k = anon_unknown_183::Flower::getLocation((Flower *)local_178,local_17c);
    this_00 = std::
              unordered_map<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_wasm::PossibleContents>_>_>
              ::operator[](&this->locationContents,__k);
    PossibleContents::operator=(this_00,other);
    local_17c = local_17c + 1;
  }
  anon_unknown_183::Flower::~Flower((Flower *)local_178);
  return;
}

Assistant:

void ContentOracle::analyze() {
  Flower flower(wasm, options);
  for (LocationIndex i = 0; i < flower.locations.size(); i++) {
    locationContents[flower.getLocation(i)] = flower.getContents(i);
  }
}